

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cmCryptoHash::ByteHashFile
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cmCryptoHash *this,string *file)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_1248;
  ifstream fin;
  int local_1228;
  byte abStack_1210 [488];
  uint64_t buffer [512];
  
  std::ifstream::ifstream(&fin,(file->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1210[*(long *)(_fin + -0x18)] & 5) == 0) {
    Initialize(this);
    while ((abStack_1210[*(long *)(_fin + -0x18)] & 5) == 0) {
      std::istream::read((char *)&fin,(long)buffer);
      if (local_1228 != 0) {
        Append(this,buffer,(long)local_1228);
      }
    }
    if ((abStack_1210[*(long *)(_fin + -0x18)] & 2) != 0) {
      Finalize(__return_storage_ptr__,this);
      goto LAB_0018d7ae;
    }
    Finalize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_1248,this);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_1248);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0018d7ae:
  std::ifstream::~ifstream(&fin);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> cmCryptoHash::ByteHashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | std::ios::binary);
  if (fin) {
    this->Initialize();
    {
      // Should be efficient enough on most system:
      KWIML_INT_uint64_t buffer[512];
      char* buffer_c = reinterpret_cast<char*>(buffer);
      unsigned char const* buffer_uc =
        reinterpret_cast<unsigned char const*>(buffer);
      // This copy loop is very sensitive on certain platforms with
      // slightly broken stream libraries (like HPUX).  Normally, it is
      // incorrect to not check the error condition on the fin.read()
      // before using the data, but the fin.gcount() will be zero if an
      // error occurred.  Therefore, the loop should be safe everywhere.
      while (fin) {
        fin.read(buffer_c, sizeof(buffer));
        if (int gcount = static_cast<int>(fin.gcount())) {
          this->Append(buffer_uc, gcount);
        }
      }
    }
    if (fin.eof()) {
      // Success
      return this->Finalize();
    }
    // Finalize anyway
    this->Finalize();
  }
  // Return without success
  return std::vector<unsigned char>();
}